

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnAtomicNotifyExpr
          (ExprVisitorDelegate *this,AtomicNotifyExpr *expr)

{
  AtomicNotifyExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  (anonymous_namespace)::WatWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
            ((WatWriter *)this->writer_,(Expr *)expr);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnAtomicNotifyExpr(
    AtomicNotifyExpr* expr) {
  writer_->WriteLoadStoreExpr<AtomicNotifyExpr>(expr);
  return Result::Ok;
}